

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

uint32_t __thiscall
spirv_cross::CompilerMSL::ensure_correct_builtin_type
          (CompilerMSL *this,uint32_t type_id,BuiltIn builtin)

{
  uint32_t uVar1;
  uint32_t uVar2;
  bool bVar3;
  undefined2 uVar4;
  Dim DVar5;
  bool bVar6;
  undefined1 uVar7;
  ImageFormat IVar8;
  AccessQualifier AVar9;
  TypeID TVar10;
  TypeID TVar11;
  bool bVar12;
  uint32_t id;
  SPIRType *type;
  SPIRType *pSVar13;
  SPIRType *pSVar14;
  
  type = Variant::get<spirv_cross::SPIRType>
                   ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                    super_VectorView<spirv_cross::Variant>.ptr + type_id);
  if ((1 < builtin - BuiltInLayer) && (builtin != BuiltInFragStencilRefEXT)) {
    if (builtin != BuiltInSampleMask) {
      return type_id;
    }
    bVar12 = Compiler::is_array((Compiler *)this,type);
    if (bVar12) goto LAB_0025a63c;
    if (1 < builtin - BuiltInLayer) {
      return type_id;
    }
  }
  if (*(int *)&(type->super_IVariant).field_0xc == 8) {
    return type_id;
  }
LAB_0025a63c:
  id = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,type->pointer + 1);
  pSVar13 = Compiler::set<spirv_cross::SPIRType>((Compiler *)this,id);
  *(undefined8 *)&(pSVar13->super_IVariant).field_0xc = 0x2000000008;
  if (type->pointer == true) {
    pSVar14 = Compiler::set<spirv_cross::SPIRType>((Compiler *)this,id + 1);
    (pSVar14->super_IVariant).self.id = (pSVar13->super_IVariant).self.id;
    uVar1 = pSVar13->vecsize;
    uVar2 = pSVar13->columns;
    *(undefined8 *)&(pSVar14->super_IVariant).field_0xc =
         *(undefined8 *)&(pSVar13->super_IVariant).field_0xc;
    pSVar14->vecsize = uVar1;
    pSVar14->columns = uVar2;
    SmallVector<unsigned_int,_8UL>::operator=(&pSVar14->array,&pSVar13->array);
    SmallVector<bool,_8UL>::operator=(&pSVar14->array_size_literal,&pSVar13->array_size_literal);
    bVar12 = pSVar13->pointer;
    bVar3 = pSVar13->forward_pointer;
    uVar4 = *(undefined2 *)&pSVar13->field_0x7e;
    pSVar14->pointer_depth = pSVar13->pointer_depth;
    pSVar14->pointer = bVar12;
    pSVar14->forward_pointer = bVar3;
    *(undefined2 *)&pSVar14->field_0x7e = uVar4;
    pSVar14->storage = pSVar13->storage;
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::operator=
              (&pSVar14->member_types,&pSVar13->member_types);
    SmallVector<unsigned_int,_8UL>::operator=
              (&pSVar14->member_type_index_redirection,&pSVar13->member_type_index_redirection);
    DVar5 = (pSVar13->image).dim;
    bVar12 = (pSVar13->image).depth;
    bVar3 = (pSVar13->image).arrayed;
    bVar6 = (pSVar13->image).ms;
    uVar7 = (pSVar13->image).field_0xb;
    uVar1 = (pSVar13->image).sampled;
    IVar8 = (pSVar13->image).format;
    AVar9 = (pSVar13->image).access;
    TVar10.id = (pSVar13->type_alias).id;
    TVar11.id = (pSVar13->parent_type).id;
    (pSVar14->image).type = (TypeID)(pSVar13->image).type.id;
    (pSVar14->image).dim = DVar5;
    (pSVar14->image).depth = bVar12;
    (pSVar14->image).arrayed = bVar3;
    (pSVar14->image).ms = bVar6;
    (pSVar14->image).field_0xb = uVar7;
    (pSVar14->image).sampled = uVar1;
    (pSVar14->image).format = IVar8;
    (pSVar14->image).access = AVar9;
    pSVar14->type_alias = (TypeID)TVar10.id;
    pSVar14->parent_type = (TypeID)TVar11.id;
    if (pSVar13 != pSVar14) {
      ::std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&pSVar14->member_name_cache,&(pSVar13->member_name_cache)._M_h);
    }
    pSVar14->pointer = true;
    pSVar14->storage = type->storage;
    (pSVar14->parent_type).id = id;
    id = id + 1;
  }
  return id;
}

Assistant:

uint32_t CompilerMSL::ensure_correct_builtin_type(uint32_t type_id, BuiltIn builtin)
{
	auto &type = get<SPIRType>(type_id);

	if ((builtin == BuiltInSampleMask && is_array(type)) ||
	    ((builtin == BuiltInLayer || builtin == BuiltInViewportIndex || builtin == BuiltInFragStencilRefEXT) &&
	     type.basetype != SPIRType::UInt))
	{
		uint32_t next_id = ir.increase_bound_by(type.pointer ? 2 : 1);
		uint32_t base_type_id = next_id++;
		auto &base_type = set<SPIRType>(base_type_id);
		base_type.basetype = SPIRType::UInt;
		base_type.width = 32;

		if (!type.pointer)
			return base_type_id;

		uint32_t ptr_type_id = next_id++;
		auto &ptr_type = set<SPIRType>(ptr_type_id);
		ptr_type = base_type;
		ptr_type.pointer = true;
		ptr_type.storage = type.storage;
		ptr_type.parent_type = base_type_id;
		return ptr_type_id;
	}

	return type_id;
}